

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTree.cpp
# Opt level: O2

void __thiscall DTree::extendDTree(DTree *this,DTreeNode *node)

{
  DTreeNode *node_00;
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  DTreeNode **ppDVar4;
  int i;
  long lVar5;
  
  std::vector<int,_std::allocator<int>_>::push_back(&node->_schema,&node->_id);
  uVar2 = (ulong)node->_numOfChildren;
  uVar3 = 0xffffffffffffffff;
  if (-2 < (long)uVar2) {
    uVar3 = uVar2 * 4 + 4;
  }
  piVar1 = (int *)operator_new__(uVar3);
  node->_childrenIDs = piVar1;
  ppDVar4 = &node->_firstChild;
  for (lVar5 = 0; lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
    node_00 = *ppDVar4;
    extendDTree(this,node_00);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&node->_schema,
               (const_iterator)
               (node->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (node_00->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (node_00->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    node->_childrenIDs[lVar5] = node_00->_id;
    ppDVar4 = &node_00->_next;
    uVar2 = (ulong)(uint)node->_numOfChildren;
  }
  return;
}

Assistant:

void DTree::extendDTree(DTreeNode* node)
{
	node->_schema.push_back(node->_id);
	node->_childrenIDs = new int[node->_numOfChildren + 1];

	/* Copy the schema from all children up. */
	DTreeNode* child = node->_firstChild;
	for (int i = 0; i < node->_numOfChildren; ++i)
	{
		extendDTree(child);
		node->_schema.insert(node->_schema.end(), child->_schema.begin(),
				child->_schema.end());
		node->_childrenIDs[i] = child->_id;
		child = child->_next;
	}
}